

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

roaring_bitmap_t *
roaring_bitmap_lazy_or(roaring_bitmap_t *x1,roaring_bitmap_t *x2,_Bool bitsetconversion)

{
  ushort key;
  bitset_container_t *c;
  byte bVar1;
  roaring_array_t *ra;
  container_t *pcVar2;
  roaring_bitmap_t *prVar3;
  ushort *puVar4;
  bitset_container_t *c_00;
  byte bVar5;
  uint uVar6;
  undefined7 in_register_00000011;
  uint uVar7;
  uint16_t key_00;
  roaring_array_t *prVar8;
  roaring_array_t *sa;
  long *c_01;
  int iVar9;
  ulong uVar10;
  uint8_t result_type;
  uint8_t type1;
  uint8_t type2;
  bitset_container_t *local_80;
  roaring_array_t *local_78;
  uint local_64;
  ulong local_60;
  ulong local_58;
  roaring_array_t *local_50;
  undefined4 local_44;
  ulong local_40;
  undefined8 local_38;
  
  result_type = '\0';
  uVar7 = (x1->high_low_container).size;
  local_58 = (ulong)uVar7;
  prVar3 = x2;
  if (uVar7 != 0) {
    uVar6 = (x2->high_low_container).size;
    prVar3 = x1;
    if (uVar6 != 0) {
      local_44 = (undefined4)CONCAT71(in_register_00000011,bitsetconversion);
      ra = &roaring_bitmap_create_with_capacity(uVar6 + uVar7)->high_low_container;
      bVar1 = 1;
      if (((x1->high_low_container).flags & 1) == 0) {
        bVar1 = (x2->high_low_container).flags & 1;
      }
      ra->flags = ra->flags & 0xfe | bVar1;
      puVar4 = (x1->high_low_container).keys;
      key_00 = *(x2->high_low_container).keys;
      local_40 = (ulong)(uVar6 - 1);
      local_64 = 0;
      uVar10 = 0;
      local_60 = (ulong)uVar6;
      local_50 = &x1->high_low_container;
LAB_001041ff:
      do {
        key = *puVar4;
        uVar10 = (ulong)(int)uVar10;
        while( true ) {
          sa = local_50;
          uVar7 = local_64;
          iVar9 = (int)uVar10;
          if (key == key_00) break;
          if (key < key_00) {
            type1 = local_50->typecodes[local_64 & 0xffff];
            local_78 = ra;
            pcVar2 = get_copy_of_container
                               (local_50->containers[local_64 & 0xffff],&type1,
                                (_Bool)(local_50->flags & 1));
            if ((sa->flags & 1) != 0) {
              sa->containers[(int)uVar7] = pcVar2;
              sa->typecodes[(int)uVar7] = type1;
            }
            ra_append(local_78,key,pcVar2,type1);
            uVar7 = uVar7 + 1;
            ra = local_78;
            if (uVar7 == (uint)local_58) goto LAB_00104657;
            puVar4 = (ushort *)((ulong)((uVar7 & 0xffff) * 2) + (long)sa->keys);
            local_64 = uVar7;
            goto LAB_001041ff;
          }
          type2 = (x2->high_low_container).typecodes[uVar10 & 0xffff];
          pcVar2 = get_copy_of_container
                             ((x2->high_low_container).containers[uVar10 & 0xffff],&type2,
                              (_Bool)((x2->high_low_container).flags & 1));
          if (((x2->high_low_container).flags & 1) != 0) {
            (x2->high_low_container).containers[uVar10] = pcVar2;
            (x2->high_low_container).typecodes[uVar10] = type2;
          }
          ra_append(ra,key_00,pcVar2,type2);
          if ((int)local_40 == iVar9) {
            uVar6 = (uint)local_58;
            sa = local_50;
            uVar10 = local_60;
            uVar7 = local_64;
            goto LAB_00104653;
          }
          uVar10 = uVar10 + 1;
          key_00 = (x2->high_low_container).keys[uVar10 & 0xffff];
        }
        type1 = local_50->typecodes[local_64 & 0xffff];
        c_01 = (long *)local_50->containers[local_64 & 0xffff];
        type2 = (x2->high_low_container).typecodes[uVar10 & 0xffff];
        prVar8 = (roaring_array_t *)(x2->high_low_container).containers[uVar10 & 0xffff];
        if ((char)local_44 == '\0') {
LAB_001042ee:
          bVar1 = type1;
          if (type1 == 4) {
            bVar1 = *(byte *)(c_01 + 1);
            c_01 = (long *)*c_01;
          }
          bVar5 = type2;
          if (type2 == 4) {
            bVar5 = *(byte *)&prVar8->containers;
            prVar8 = *(roaring_array_t **)prVar8;
          }
          local_38 = 0;
          prVar3 = (roaring_bitmap_t *)
                   (*(code *)(&DAT_0011b5a4 +
                             *(int *)(&DAT_0011b5a4 +
                                     (ulong)(((uint)bVar5 + (uint)bVar1 * 4) - 5) * 4)))
                             (c_01,prVar8);
          return prVar3;
        }
        bVar1 = type1;
        if (type1 == 4) {
          bVar1 = *(byte *)(c_01 + 1);
        }
        if (bVar1 == 1) goto LAB_001042ee;
        bVar1 = type2;
        if (type2 == 4) {
          bVar1 = *(byte *)&prVar8->containers;
        }
        if (bVar1 == 1) goto LAB_001042ee;
        if (type1 == 4) {
          type1 = (uint8_t)c_01[1];
          c_01 = (long *)*c_01;
        }
        local_78 = prVar8;
        local_80 = container_to_bitset(c_01,type1);
        type1 = '\x01';
        c_00 = (bitset_container_t *)container_lazy_ior(local_80,'\x01',local_78,type2,&result_type)
        ;
        c = local_80;
        if (c_00 != local_80) {
          local_80 = c_00;
          container_free(c,type1);
          c_00 = local_80;
        }
        ra_append(ra,key,c_00,result_type);
        uVar7 = uVar7 + 1;
        uVar6 = (uint)local_58;
        if ((uVar7 == uVar6) || ((int)local_40 == iVar9)) {
          uVar10 = (ulong)(iVar9 + 1);
LAB_00104653:
          if (uVar7 == uVar6) {
LAB_00104657:
            bVar1 = (x2->high_low_container).flags;
            uVar7 = (uint)uVar10;
            uVar6 = (uint)local_60;
            sa = &x2->high_low_container;
          }
          else {
            if ((int)uVar10 != (int)local_60) {
              return (roaring_bitmap_t *)ra;
            }
            bVar1 = sa->flags;
          }
          ra_append_copy_range(ra,sa,uVar7,uVar6,(_Bool)(bVar1 & 1));
          return (roaring_bitmap_t *)ra;
        }
        uVar10 = uVar10 + 1;
        puVar4 = (ushort *)((ulong)((uVar7 & 0xffff) * 2) + (long)sa->keys);
        key_00 = (x2->high_low_container).keys[(uint)uVar10 & 0xffff];
        local_64 = uVar7;
      } while( true );
    }
  }
  prVar3 = roaring_bitmap_copy(prVar3);
  return prVar3;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_lazy_or(const roaring_bitmap_t *x1,
                                         const roaring_bitmap_t *x2,
                                         const bool bitsetconversion) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        return roaring_bitmap_copy(x2);
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer =
        roaring_bitmap_create_with_capacity(length1 + length2);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) || is_cow(x2));
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            container_t *c;
            if (bitsetconversion &&
                (get_container_type(c1, type1) != BITSET_CONTAINER_TYPE) &&
                (get_container_type(c2, type2) != BITSET_CONTAINER_TYPE)) {
                container_t *newc1 =
                    container_mutable_unwrap_shared(c1, &type1);
                newc1 = container_to_bitset(newc1, type1);
                type1 = BITSET_CONTAINER_TYPE;
                c = container_lazy_ior(newc1, type1, c2, type2, &result_type);
                if (c != newc1) {  // should not happen
                    container_free(newc1, type1);
                }
            } else {
                c = container_lazy_or(c1, type1, c2, type2, &result_type);
            }
            // since we assume that the initial containers are non-empty,
            // the
            // result here
            // can only be non-empty
            ra_append(&answer->high_low_container, s1, c, result_type);
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            c1 = get_copy_of_container(c1, &type1, is_cow(x1));
            if (is_cow(x1)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c1,
                                          type1);
            }
            ra_append(&answer->high_low_container, s1, c1, type1);
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_append(&answer->high_low_container, s2, c2, type2);
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&answer->high_low_container,
                             &x2->high_low_container, pos2, length2,
                             is_cow(x2));
    } else if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}